

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

MatchProperties __thiscall cmFileCopier::CollectMatchProperties(cmFileCopier *this,char *file)

{
  MatchProperties MVar1;
  bool bVar2;
  pointer pMVar3;
  allocator local_61;
  string local_60;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_40;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_38;
  iterator mr;
  bool matched;
  char *file_to_match;
  char *file_local;
  cmFileCopier *this_local;
  MatchProperties result;
  
  mr._M_current._7_1_ = 0;
  MatchProperties::MatchProperties((MatchProperties *)&this_local);
  local_38._M_current =
       (MatchRule *)
       std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::begin
                 (&this->MatchRules);
  while( true ) {
    local_40._M_current =
         (MatchRule *)
         std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                   (&this->MatchRules);
    bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar2) break;
    pMVar3 = __gnu_cxx::
             __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
             ::operator->(&local_38);
    bVar2 = cmsys::RegularExpression::find(&pMVar3->Regex,file);
    if (bVar2) {
      mr._M_current._7_1_ = 1;
      pMVar3 = __gnu_cxx::
               __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
               ::operator->(&local_38);
      this_local._0_4_ =
           CONCAT31(this_local._1_3_,
                    ((uint)this_local & 1) != 0 || ((pMVar3->Properties).Exclude & 1U) != 0);
      pMVar3 = __gnu_cxx::
               __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
               ::operator->(&local_38);
      this_local._4_4_ = (pMVar3->Properties).Permissions | this_local._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
    ::operator++(&local_38);
  }
  if (((mr._M_current._7_1_ & 1) == 0) && ((this->MatchlessFiles & 1U) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,file,&local_61);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_60);
    this_local._0_4_ = (CONCAT31(this_local._1_3_,bVar2) ^ 0xff) & 0xffffff01;
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  MVar1.Permissions = this_local._4_4_;
  MVar1._0_4_ = (uint)this_local;
  return MVar1;
}

Assistant:

MatchProperties CollectMatchProperties(const char* file)
  {
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
    std::string lower = cmSystemTools::LowerCase(file);
    const char* file_to_match = lower.c_str();
#else
    const char* file_to_match = file;
#endif

    // Collect properties from all matching rules.
    bool matched = false;
    MatchProperties result;
    for (std::vector<MatchRule>::iterator mr = this->MatchRules.begin();
         mr != this->MatchRules.end(); ++mr) {
      if (mr->Regex.find(file_to_match)) {
        matched = true;
        result.Exclude |= mr->Properties.Exclude;
        result.Permissions |= mr->Properties.Permissions;
      }
    }
    if (!matched && !this->MatchlessFiles) {
      result.Exclude = !cmSystemTools::FileIsDirectory(file);
    }
    return result;
  }